

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

InternalParseResult * __thiscall
clara::detail::ExeName::parse
          (InternalParseResult *__return_storage_ptr__,ExeName *this,string *param_1,
          TokenStream *tokens)

{
  ParseState local_58;
  TokenStream *local_28;
  TokenStream *tokens_local;
  string *param_1_local;
  ExeName *this_local;
  
  local_28 = tokens;
  tokens_local = (TokenStream *)param_1;
  param_1_local = (string *)this;
  this_local = (ExeName *)__return_storage_ptr__;
  ParseState::ParseState(&local_58,NoMatch,tokens);
  BasicResult<clara::detail::ParseState>::ok<clara::detail::ParseState>
            (__return_storage_ptr__,&local_58);
  ParseState::~ParseState(&local_58);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
        }